

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O0

self * __thiscall
boost::python::
class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
::def<int(MlmWrap::*)()>
          (class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
           *this,char *name,first_type f)

{
  type *ptVar1;
  def_helper<const_char_*,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  *in_RCX;
  first_type in_RDX;
  char *in_RSI;
  class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  *in_RDI;
  char **in_stack_ffffffffffffff38;
  undefined1 local_80 [56];
  
  ptVar1 = detail::unwrap_wrapper<PythonModuleClient>((PythonModuleClient *)0x0);
  detail::
  def_helper<const_char_*,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::def_helper(in_RCX,in_stack_ffffffffffffff38);
  def_impl<AbstractModuleClient,int(MlmWrap::*)(),boost::python::detail::def_helper<char_const*,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
            (in_RDI,ptVar1,in_RSI,in_RDX,in_RCX,local_80,&stack0xffffffffffffffd0);
  return in_RDI;
}

Assistant:

self& def(char const* name, F f)
    {
        this->def_impl(
            detail::unwrap_wrapper((W*)0)
          , name, f, detail::def_helper<char const*>(0), &f);
        return *this;
    }